

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffihtps(void)

{
  return 0;
}

Assistant:

int ffihtps(void)
{
   /* Wrapper function for global initialization of curl library.
      This is NOT THREAD-SAFE */
   int status=0;
#ifdef CFITSIO_HAVE_CURL
   if (curl_global_init(CURL_GLOBAL_ALL))
      /* Do we want to define a new CFITSIO error code for this? */
      status = -1;
#endif
   return status;
}